

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

SwapchainBuilder * __thiscall
vkb::SwapchainBuilder::use_default_format_selection(SwapchainBuilder *this)

{
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *this_00;
  pointer pVVar1;
  VkSurfaceFormatKHR local_20;
  
  this_00 = &(this->info).desired_formats;
  pVVar1 = (this->info).desired_formats.
           super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->info).desired_formats.
      super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar1) {
    (this->info).desired_formats.
    super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar1;
  }
  local_20.format = VK_FORMAT_B8G8R8A8_SRGB;
  local_20.colorSpace = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
  std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::
  emplace_back<VkSurfaceFormatKHR>(this_00,&local_20);
  local_20.format = VK_FORMAT_R8G8B8A8_SRGB;
  local_20.colorSpace = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
  std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::
  emplace_back<VkSurfaceFormatKHR>(this_00,&local_20);
  return this;
}

Assistant:

SwapchainBuilder& SwapchainBuilder::use_default_format_selection() {
    info.desired_formats.clear();
    add_desired_formats(info.desired_formats);
    return *this;
}